

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# webassembly.cc
# Opt level: O2

void bloaty::wasm::ParseSymbols(RangeSink *sink)

{
  bool bVar1;
  uint32_t uVar2;
  RangeSink *in_R8;
  string_view local_f8;
  unordered_map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  dataseg_names;
  unordered_map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  func_names;
  undefined1 local_78 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70 [2];
  
  func_names._M_h._M_buckets = &func_names._M_h._M_single_bucket;
  func_names._M_h._M_bucket_count = 1;
  func_names._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  func_names._M_h._M_element_count = 0;
  func_names._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  func_names._M_h._M_rehash_policy._M_next_resize = 0;
  func_names._M_h._M_single_bucket = (__node_base_ptr)0x0;
  dataseg_names._M_h._M_buckets = &dataseg_names._M_h._M_single_bucket;
  dataseg_names._M_h._M_bucket_count = 1;
  dataseg_names._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  dataseg_names._M_h._M_element_count = 0;
  dataseg_names._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  dataseg_names._M_h._M_rehash_policy._M_next_resize = 0;
  dataseg_names._M_h._M_single_bucket = (__node_base_ptr)0x0;
  local_f8._M_len = (sink->file_->data_)._M_len;
  local_f8._M_str = (sink->file_->data_)._M_str;
  ReadMagic(&local_f8);
  while (local_f8._M_len != 0) {
    Section::Read((Section *)local_78,&local_f8);
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            (local_78 + 8),"name");
    if (bVar1) {
      ReadNames((wasm *)local_78,(Section *)&func_names,&dataseg_names,(IndexedNames *)sink,in_R8);
    }
    std::__cxx11::string::~string((string *)(local_78 + 8));
  }
  local_f8._M_len = (sink->file_->data_)._M_len;
  local_f8._M_str = (sink->file_->data_)._M_str;
  ReadMagic(&local_f8);
  uVar2 = 0;
  while (local_f8._M_len != 0) {
    Section::Read((Section *)local_78,&local_f8);
    if (local_78._0_4_ == 0xb) {
      ReadDataSection((Section *)local_78,&dataseg_names,sink);
    }
    else if (local_78._0_4_ == 10) {
      ReadCodeSection((wasm *)local_78,(Section *)&func_names,(IndexedNames *)(ulong)uVar2,
                      (uint32_t)sink,in_R8);
    }
    else if (local_78._0_4_ == 2) {
      uVar2 = GetNumFunctionImports((Section *)local_78);
    }
    std::__cxx11::string::~string((string *)(local_78 + 8));
  }
  std::
  _Hashtable<int,_std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&dataseg_names._M_h);
  std::
  _Hashtable<int,_std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&func_names._M_h);
  return;
}

Assistant:

void ParseSymbols(RangeSink* sink) {
  // First pass: read the custom naming section to get function names.
  std::unordered_map<int, std::string> func_names;
  std::unordered_map<int, std::string> dataseg_names;
  uint32_t num_imports = 0;

  ForEachSection(sink->input_file().data(),
                 [&func_names, &dataseg_names, sink](const Section& section) {
                   if (section.name == "name") {
                     ReadNames(section, &func_names, &dataseg_names, sink);
                   }
                 });

  // Second pass: read the function/code sections.
  ForEachSection(sink->input_file().data(),
                 [&func_names, &dataseg_names, &num_imports, sink](const Section& section) {
                   if (section.id == Section::kImport) {
                     num_imports = GetNumFunctionImports(section);
                   } else if (section.id == Section::kCode) {
                     ReadCodeSection(section, func_names, num_imports, sink);
                   } else if (section.id == Section::kData) {
                     ReadDataSection(section, dataseg_names, sink);
                   }
                 });
}